

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  value_type vVar2;
  double dVar3;
  value_type vVar4;
  double dVar5;
  
  vVar2 = FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>::dx
                    (&this->left_->fadexpr_,i);
  dVar3 = cos(((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ /
              (double)(this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  vVar4 = FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>::dx
                    (&this->right_->fadexpr_,i);
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  dVar5 = (((this->left_->fadexpr_).right_)->fadexpr_).expr_.val_;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  return vVar2 * dVar3 + vVar4 * dVar1 * dVar5;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}